

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
typeCheckValue(UA_Server *server,UA_NodeId *targetDataTypeId,UA_Int32 targetValueRank,
              size_t targetArrayDimensionsSize,UA_UInt32 *targetArrayDimensions,UA_Variant *value,
              UA_NumericRange *range,UA_Variant *editableValue)

{
  UA_Boolean UVar1;
  UA_UInt32 local_6c;
  UA_UInt32 *pUStack_68;
  UA_UInt32 tempArrayDimensions;
  UA_UInt32 *valueArrayDimensions;
  size_t valueArrayDimensionsSize;
  UA_NodeId subtypeId;
  UA_Variant *value_local;
  UA_UInt32 *targetArrayDimensions_local;
  size_t targetArrayDimensionsSize_local;
  UA_Int32 targetValueRank_local;
  UA_NodeId *targetDataTypeId_local;
  UA_Server *server_local;
  
  subtypeId.identifier.string.data = (UA_Byte *)value;
  if ((value->type != (UA_DataType *)0x0) &&
     (UVar1 = UA_NodeId_equal(&value->type->typeId,targetDataTypeId), !UVar1)) {
    UA_NODEID_NUMERIC((UA_NodeId *)&valueArrayDimensionsSize,0,0x2d);
    UVar1 = isNodeInTree(server->nodestore,
                         (UA_NodeId *)(*(long *)subtypeId.identifier.string.data + 8),
                         targetDataTypeId,(UA_NodeId *)&valueArrayDimensionsSize,1);
    if (!UVar1) {
      if (editableValue == (UA_Variant *)0x0) {
        return 0x80740000;
      }
      subtypeId.identifier.string.data =
           (UA_Byte *)
           convertToMatchingValue
                     (server,(UA_Variant *)subtypeId.identifier.string.data,targetDataTypeId,
                      editableValue);
      if ((UA_Variant *)subtypeId.identifier.string.data == (UA_Variant *)0x0) {
        return 0x80740000;
      }
    }
  }
  if (range == (UA_NumericRange *)0x0) {
    valueArrayDimensions = *(UA_UInt32 **)(subtypeId.identifier.string.data + 0x20);
    pUStack_68 = *(UA_UInt32 **)(subtypeId.identifier.string.data + 0x28);
    if ((pUStack_68 == (UA_UInt32 *)0x0) &&
       (UVar1 = UA_Variant_isScalar((UA_Variant *)subtypeId.identifier.string.data), !UVar1)) {
      valueArrayDimensions = (UA_UInt32 *)0x1;
      local_6c = (UA_UInt32)*(undefined8 *)(subtypeId.identifier.string.data + 0x10);
      pUStack_68 = &local_6c;
    }
    if (targetArrayDimensionsSize == 0) {
      server_local._4_4_ =
           compatibleValueRankValue(targetValueRank,(UA_Variant *)subtypeId.identifier.string.data);
    }
    else {
      server_local._4_4_ =
           compatibleArrayDimensions
                     (targetArrayDimensionsSize,targetArrayDimensions,(size_t)valueArrayDimensions,
                      pUStack_68);
    }
  }
  else {
    server_local._4_4_ = 0;
  }
  return server_local._4_4_;
}

Assistant:

UA_StatusCode
typeCheckValue(UA_Server *server, const UA_NodeId *targetDataTypeId,
               UA_Int32 targetValueRank, size_t targetArrayDimensionsSize,
               const UA_UInt32 *targetArrayDimensions, const UA_Variant *value,
               const UA_NumericRange *range, UA_Variant *editableValue) {
    /* Empty variant is only allowed for BaseDataType */
    if(!value->type)
        goto check_array;

    /* See if the types match. The nodeid on the wire may be != the nodeid in
     * the node for opaque types, enums and bytestrings. value contains the
     * correct type definition after the following paragraph */
    if(UA_NodeId_equal(&value->type->typeId, targetDataTypeId))
        goto check_array;

    /* Has the value a subtype of the required type? */
    const UA_NodeId subtypeId = UA_NODEID_NUMERIC(0, UA_NS0ID_HASSUBTYPE);
    if(isNodeInTree(server->nodestore, &value->type->typeId, targetDataTypeId, &subtypeId, 1))
        goto check_array;

    /* Try to convert to a matching value if this is wanted */
    if(!editableValue)
        return UA_STATUSCODE_BADTYPEMISMATCH;
    value = convertToMatchingValue(server, value, targetDataTypeId, editableValue);
    if(!value)
        return UA_STATUSCODE_BADTYPEMISMATCH;

 check_array:
    if(range) /* array dimensions are checked later when writing the range */
        return UA_STATUSCODE_GOOD;

    size_t valueArrayDimensionsSize = value->arrayDimensionsSize;
    UA_UInt32 *valueArrayDimensions = value->arrayDimensions;
    UA_UInt32 tempArrayDimensions;
    if(valueArrayDimensions == 0 && !UA_Variant_isScalar(value)) {
        valueArrayDimensionsSize = 1;
        tempArrayDimensions = (UA_UInt32)value->arrayLength;
        valueArrayDimensions = &tempArrayDimensions;
    }

    /* See if the array dimensions match. When arrayDimensions are defined, they
     * already hold the valuerank. */
    if(targetArrayDimensionsSize > 0)
        return compatibleArrayDimensions(targetArrayDimensionsSize, targetArrayDimensions,
                                         valueArrayDimensionsSize, valueArrayDimensions);

    /* Check if the valuerank allows for the value dimension */
    return compatibleValueRankValue(targetValueRank, value);
}